

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

ly_set * lys_node_xpath_atomize(lys_node *node,int options)

{
  int iVar1;
  lys_node *node_00;
  ly_set *set_00;
  ulong uVar2;
  lys_node *plVar3;
  lys_node *plVar4;
  uint uVar5;
  lys_node *node_01;
  undefined1 local_78 [8];
  lyxp_set set;
  
  node_00 = node;
  if (node != (lys_node *)0x0) {
    while( true ) {
      if (node_00 == (lys_node *)0x0) {
        return (ly_set *)0x0;
      }
      if ((node_00->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF)) != LYS_UNKNOWN) break;
      node_00 = lys_parent(node_00);
    }
    set_00 = ly_set_new();
    node_01 = node;
    if (set_00 != (ly_set *)0x0) {
      do {
        if (node_01 == (lys_node *)0x0) {
          return set_00;
        }
        if (((options & 2U) == 0) || ((node_01->flags & 0x200) != 0)) {
          iVar1 = lyxp_node_atomize(node_01,(lyxp_set *)local_78,0);
          if (iVar1 != 0) {
LAB_0015431a:
            ly_set_free(set_00);
            free((void *)set._8_8_);
            return (ly_set *)0x0;
          }
          for (uVar5 = 0; (uVar5 & 0xffff) < (uint)set.val._8_4_; uVar5 = uVar5 + 1) {
            uVar2 = (ulong)((uVar5 & 0xffff) << 4);
            if (*(int *)(set._8_8_ + 8 + uVar2) == 2) {
              plVar4 = *(lys_node **)(set._8_8_ + uVar2);
              plVar3 = plVar4;
              if ((options & 2U) != 0) {
                for (; (plVar3 != (lys_node *)0x0 && (plVar3 != node_00));
                    plVar3 = lys_parent(plVar3)) {
                }
                if (plVar3 != (lys_node *)0x0) goto LAB_00154292;
              }
              iVar1 = ly_set_add(set_00,plVar4,0);
              if (iVar1 == -1) goto LAB_0015431a;
            }
LAB_00154292:
          }
          free((void *)set._8_8_);
          if ((options & 1U) == 0) {
            return set_00;
          }
        }
        plVar4 = node_01->child;
        plVar3 = node_01;
        if (plVar4 != (lys_node *)0x0 &&
            (node_01->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
        goto LAB_001542d6;
        if (node_01 == node) {
          return set_00;
        }
        do {
          plVar4 = plVar3->next;
LAB_001542d6:
          node_01 = plVar4;
          if (plVar4 != (lys_node *)0x0) break;
          plVar3 = plVar3->parent;
          if (plVar3->nodetype == LYS_AUGMENT) {
            plVar3 = plVar3->prev;
          }
          set._40_8_ = lys_parent(plVar3);
          plVar4 = lys_parent(node);
        } while ((lys_node *)set._40_8_ != plVar4);
      } while( true );
    }
  }
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lys_node_xpath_atomize(const struct lys_node *node, int options)
{
    const struct lys_node *next, *elem, *parent, *tmp;
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint16_t i;

    if (!node) {
        return NULL;
    }

    for (parent = node; parent && !(parent->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
    if (!parent) {
        /* not in input, output, or notification */
        return NULL;
    }

    ret_set = ly_set_new();
    if (!ret_set) {
        return NULL;
    }

    LY_TREE_DFS_BEGIN(node, next, elem) {
        if ((options & LYXP_NO_LOCAL) && !(elem->flags & LYS_XPATH_DEP)) {
            /* elem has no dependencies from other subtrees and local nodes get discarded */
            goto next_iter;
        }

        if (lyxp_node_atomize(elem, &set, 0)) {
            ly_set_free(ret_set);
            free(set.val.snodes);
            return NULL;
        }

        for (i = 0; i < set.used; ++i) {
            switch (set.val.snodes[i].type) {
            case LYXP_NODE_ELEM:
                if (options & LYXP_NO_LOCAL) {
                    for (tmp = set.val.snodes[i].snode; tmp && (tmp != parent); tmp = lys_parent(tmp));
                    if (tmp) {
                        /* in local subtree, discard */
                        break;
                    }
                }
                if (ly_set_add(ret_set, set.val.snodes[i].snode, 0) == -1) {
                    ly_set_free(ret_set);
                    free(set.val.snodes);
                    return NULL;
                }
                break;
            default:
                /* ignore roots, text and attr should not ever appear */
                break;
            }
        }

        free(set.val.snodes);
        if (!(options & LYXP_RECURSIVE)) {
            break;
        }
next_iter:
        LY_TREE_DFS_END(node, next, elem);
    }

    return ret_set;
}